

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.c
# Opt level: O0

int cmsysString_strcasecmp(char *lhs,char *rhs)

{
  int iVar1;
  char *rhs_local;
  char *lhs_local;
  
  iVar1 = strcasecmp(lhs,rhs);
  return iVar1;
}

Assistant:

int kwsysString_strcasecmp(const char* lhs, const char* rhs)
{
#  if defined(KWSYS_STRING_USE_STRICMP)
  return _stricmp(lhs, rhs);
#  elif defined(KWSYS_STRING_USE_STRCASECMP)
  return strcasecmp(lhs, rhs);
#  else
  const char* const lower = kwsysString_strcasecmp_tolower;
  unsigned char const* us1 = (unsigned char const*)lhs;
  unsigned char const* us2 = (unsigned char const*)rhs;
  int result;
  while ((result = lower[*us1] - lower[*us2++], result == 0) && *us1++) {
  }
  return result;
#  endif
}